

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cpp
# Opt level: O0

shared_ptr<dap::Reader> __thiscall
dap::spy(dap *this,shared_ptr<dap::Reader> *r,shared_ptr<dap::Writer> *s,char *prefix)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<dap::Reader> sVar1;
  shared_ptr<(anonymous_namespace)::ReaderSpy> local_38;
  char *local_28;
  char *prefix_local;
  shared_ptr<dap::Writer> *s_local;
  shared_ptr<dap::Reader> *r_local;
  
  local_28 = prefix;
  prefix_local = (char *)s;
  s_local = (shared_ptr<dap::Writer> *)r;
  r_local = (shared_ptr<dap::Reader> *)this;
  std::
  make_shared<(anonymous_namespace)::ReaderSpy,std::shared_ptr<dap::Reader>const&,std::shared_ptr<dap::Writer>const&,char_const*&>
            ((shared_ptr<dap::Reader> *)&local_38,(shared_ptr<dap::Writer> *)r,(char **)s);
  std::shared_ptr<dap::Reader>::shared_ptr<(anonymous_namespace)::ReaderSpy,void>
            ((shared_ptr<dap::Reader> *)this,&local_38);
  std::shared_ptr<(anonymous_namespace)::ReaderSpy>::~shared_ptr(&local_38);
  sVar1.super___shared_ptr<dap::Reader,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<dap::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<dap::Reader>)sVar1.super___shared_ptr<dap::Reader,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Reader> spy(const std::shared_ptr<Reader>& r,
                            const std::shared_ptr<Writer>& s,
                            const char* prefix /* = "\n<-" */) {
  return std::make_shared<ReaderSpy>(r, s, prefix);
}